

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSat.c
# Opt level: O0

int Abc_NtkCollectSupergate_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vSuper,int fFirst,int fStopAtMux)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  bool local_41;
  int local_34;
  int i;
  int RetValue2;
  int RetValue1;
  int fStopAtMux_local;
  int fFirst_local;
  Vec_Ptr_t *vSuper_local;
  Abc_Obj_t *pNode_local;
  
  pAVar3 = Abc_ObjRegular(pNode);
  if ((*(uint *)&pAVar3->field_0x14 >> 5 & 1) == 0) {
    if ((fFirst == 0) &&
       ((((iVar1 = Abc_ObjIsComplement(pNode), iVar1 != 0 ||
          (iVar1 = Abc_ObjIsNode(pNode), iVar1 == 0)) ||
         (iVar1 = Abc_ObjFanoutNum(pNode), 1 < iVar1)) ||
        ((fStopAtMux != 0 && (iVar1 = Abc_NodeIsMuxType(pNode), iVar1 != 0)))))) {
      Vec_PtrPush(vSuper,pNode);
      pAVar3 = Abc_ObjRegular(pNode);
      *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 & 0xffffffdf | 0x20;
      pNode_local._4_4_ = 0;
    }
    else {
      iVar1 = Abc_ObjIsComplement(pNode);
      if (iVar1 != 0) {
        __assert_fail("!Abc_ObjIsComplement(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcSat.c"
                      ,0x18e,"int Abc_NtkCollectSupergate_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int)");
      }
      iVar1 = Abc_ObjIsNode(pNode);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsNode(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcSat.c"
                      ,399,"int Abc_NtkCollectSupergate_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int)");
      }
      pAVar3 = Abc_ObjChild0(pNode);
      iVar1 = Abc_NtkCollectSupergate_rec(pAVar3,vSuper,0,fStopAtMux);
      pAVar3 = Abc_ObjChild1(pNode);
      iVar2 = Abc_NtkCollectSupergate_rec(pAVar3,vSuper,0,fStopAtMux);
      if ((iVar1 == -1) || (iVar2 == -1)) {
        pNode_local._4_4_ = 0xffffffff;
      }
      else {
        local_41 = iVar1 != 0 || iVar2 != 0;
        pNode_local._4_4_ = (uint)local_41;
      }
    }
  }
  else {
    for (local_34 = 0; local_34 < vSuper->nSize; local_34 = local_34 + 1) {
      if ((Abc_Obj_t *)vSuper->pArray[local_34] == pNode) {
        return 1;
      }
    }
    local_34 = 0;
    while( true ) {
      if (vSuper->nSize <= local_34) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcSat.c"
                      ,0x183,"int Abc_NtkCollectSupergate_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int)");
      }
      pAVar3 = (Abc_Obj_t *)vSuper->pArray[local_34];
      pAVar4 = Abc_ObjNot(pNode);
      if (pAVar3 == pAVar4) break;
      local_34 = local_34 + 1;
    }
    pNode_local._4_4_ = 0xffffffff;
  }
  return pNode_local._4_4_;
}

Assistant:

int Abc_NtkCollectSupergate_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vSuper, int fFirst, int fStopAtMux )
{
    int RetValue1, RetValue2, i;
    // check if the node is visited
    if ( Abc_ObjRegular(pNode)->fMarkB )
    {
        // check if the node occurs in the same polarity
        for ( i = 0; i < vSuper->nSize; i++ )
            if ( vSuper->pArray[i] == pNode )
                return 1;
        // check if the node is present in the opposite polarity
        for ( i = 0; i < vSuper->nSize; i++ )
            if ( vSuper->pArray[i] == Abc_ObjNot(pNode) )
                return -1;
        assert( 0 );
        return 0;
    }
    // if the new node is complemented or a PI, another gate begins
    if ( !fFirst )
        if ( Abc_ObjIsComplement(pNode) || !Abc_ObjIsNode(pNode) || Abc_ObjFanoutNum(pNode) > 1 || (fStopAtMux && Abc_NodeIsMuxType(pNode)) )
        {
            Vec_PtrPush( vSuper, pNode );
            Abc_ObjRegular(pNode)->fMarkB = 1;
            return 0;
        }
    assert( !Abc_ObjIsComplement(pNode) );
    assert( Abc_ObjIsNode(pNode) );
    // go through the branches
    RetValue1 = Abc_NtkCollectSupergate_rec( Abc_ObjChild0(pNode), vSuper, 0, fStopAtMux );
    RetValue2 = Abc_NtkCollectSupergate_rec( Abc_ObjChild1(pNode), vSuper, 0, fStopAtMux );
    if ( RetValue1 == -1 || RetValue2 == -1 )
        return -1;
    // return 1 if at least one branch has a duplicate
    return RetValue1 || RetValue2;
}